

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O2

string * __thiscall
wabt::Decompiler::OpcodeToToken_abi_cxx11_
          (string *__return_storage_ptr__,Decompiler *this,Opcode opcode)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  char *pcVar1;
  char local_f [2];
  allocator local_d;
  Opcode local_c;
  
  local_c.enum_ = opcode.enum_;
  pcVar1 = Opcode::GetDecomp(&local_c);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_d);
  __first._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_f[1] = 0x2e;
  local_f[0] = '_';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(__first._M_current + __return_storage_ptr__->_M_string_length),local_f + 1,
             local_f);
  return __return_storage_ptr__;
}

Assistant:

std::string OpcodeToToken(Opcode opcode) {
    std::string s = opcode.GetDecomp();
    std::replace(s.begin(), s.end(), '.', '_');
    return s;
  }